

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcOpAlg.c
# Opt level: O2

int Mvc_CoverAlgebraicEqual(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  Mvc_Cube_t *pMVar1;
  Mvc_Cube_t *pMVar2;
  int _i_;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (pCover1->nBits != pCover2->nBits) {
    __assert_fail("pCover1->nBits == pCover2->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcOpAlg.c"
                  ,0x8d,"int Mvc_CoverAlgebraicEqual(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  pMVar2 = (Mvc_Cube_t *)&pCover1->lCubes;
LAB_0037eaee:
  do {
    pMVar2 = pMVar2->pNext;
    pMVar1 = (Mvc_Cube_t *)&pCover2->lCubes;
    if (pMVar2 == (Mvc_Cube_t *)0x0) {
      return 1;
    }
    do {
      while( true ) {
        pMVar1 = pMVar1->pNext;
        if (pMVar1 == (Mvc_Cube_t *)0x0) {
          return 0;
        }
        uVar3 = *(uint *)&pMVar2->field_0x8 & 0xffffff;
        if (uVar3 == 0) break;
        if (uVar3 == 1) {
          if ((pMVar2->pData[0] == pMVar1->pData[0]) &&
             (*(int *)&pMVar2->field_0x14 == *(int *)&pMVar1->field_0x14)) goto LAB_0037eaee;
        }
        else {
          do {
            if ((int)uVar3 < 0) goto LAB_0037eaee;
            uVar4 = (ulong)uVar3;
            uVar5 = (ulong)uVar3;
            uVar3 = uVar3 - 1;
          } while (pMVar2->pData[uVar4] == pMVar1->pData[uVar5]);
        }
      }
    } while (pMVar2->pData[0] != pMVar1->pData[0]);
  } while( true );
}

Assistant:

int Mvc_CoverAlgebraicEqual( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    Mvc_Cube_t * pCube1, * pCube2;
    int fFound;
    int CompResult;

    // covers should be the same base
    assert( pCover1->nBits == pCover2->nBits );
    // iterate through the cubes
    Mvc_CoverForEachCube( pCover1, pCube1 )
    {
        fFound = 0;
        Mvc_CoverForEachCube( pCover2, pCube2 )
        {
            Mvc_CubeBitEqual( CompResult, pCube1, pCube2 );
            if ( CompResult )
            {
                fFound = 1;
                break;
            }
        }
        if ( !fFound )
            return 0;
    }
    return 1;
}